

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::StopNodes(CConnman *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  CConnman *in_RDI;
  long in_FS_OFFSET;
  CNode *pnode_1;
  list<CNode_*,_std::allocator<CNode_*>_> *__range1_1;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  vector<CNode_*,_std::allocator<CNode_*>_> nodes;
  vector<CAddress,_std::allocator<CAddress>_> anchors_to_dump;
  path *in_stack_fffffffffffffef8;
  CNode *in_stack_ffffffffffffff00;
  path *in_stack_ffffffffffffff10;
  vector<CAddress,_std::allocator<CAddress>_> *in_stack_ffffffffffffff18;
  CConnman *in_stack_ffffffffffffff38;
  CConnman *anchors_db_path;
  CConnman *in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->fAddressesInitialized & 1U) != 0) {
    anchors_db_path = in_RDI;
    DumpAddresses(in_stack_ffffffffffffff38);
    in_RDI->fAddressesInitialized = false;
    if ((in_RDI->m_use_addrman_outgoing & 1U) != 0) {
      GetCurrentBlockRelayOnlyConns(in_stack_ffffffffffffff50);
      sVar3 = std::vector<CAddress,_std::allocator<CAddress>_>::size
                        ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffef8);
      if (2 < sVar3) {
        std::vector<CAddress,_std::allocator<CAddress>_>::resize
                  (in_stack_ffffffffffffff18,(size_type)in_stack_ffffffffffffff10);
      }
      ArgsManager::GetDataDirNet((ArgsManager *)in_stack_ffffffffffffff00);
      fs::operator/(in_stack_ffffffffffffff10,(char *)in_RDI);
      DumpAnchors((path *)anchors_db_path,
                  (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffff38);
      fs::path::~path(in_stack_fffffffffffffef8);
      fs::path::~path(in_stack_fffffffffffffef8);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)in_RDI);
    }
  }
  std::vector<CNode_*,_std::allocator<CNode_*>_>::vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffef8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffef8);
  StopNodes::anon_class_16_2_f83b539e::operator()((anon_class_16_2_f83b539e *)in_RDI);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff00);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff00);
  while (bVar2 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_ffffffffffffff00), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
              in_stack_fffffffffffffef8);
    CNode::CloseSocketDisconnect((CNode *)in_stack_ffffffffffffff38);
    DeleteNode(in_RDI,in_stack_ffffffffffffff00);
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               in_stack_fffffffffffffef8);
  }
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::begin
            ((list<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff00);
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::end
            ((list<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff00);
  while (bVar2 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_ffffffffffffff00),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_List_iterator<CNode_*>::operator*((_List_iterator<CNode_*> *)in_stack_fffffffffffffef8);
    DeleteNode(in_RDI,in_stack_ffffffffffffff00);
    std::_List_iterator<CNode_*>::operator++((_List_iterator<CNode_*> *)in_stack_fffffffffffffef8);
  }
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::clear
            ((list<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffef8);
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::clear
            ((vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *)
             in_stack_fffffffffffffef8);
  std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::reset
            ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)in_stack_fffffffffffffef8,
             (pointer)0x21e34d);
  std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::reset
            ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)in_stack_fffffffffffffef8,
             (pointer)0x21e363);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::~vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::StopNodes()
{
    if (fAddressesInitialized) {
        DumpAddresses();
        fAddressesInitialized = false;

        if (m_use_addrman_outgoing) {
            // Anchor connections are only dumped during clean shutdown.
            std::vector<CAddress> anchors_to_dump = GetCurrentBlockRelayOnlyConns();
            if (anchors_to_dump.size() > MAX_BLOCK_RELAY_ONLY_ANCHORS) {
                anchors_to_dump.resize(MAX_BLOCK_RELAY_ONLY_ANCHORS);
            }
            DumpAnchors(gArgs.GetDataDirNet() / ANCHORS_DATABASE_FILENAME, anchors_to_dump);
        }
    }

    // Delete peer connections.
    std::vector<CNode*> nodes;
    WITH_LOCK(m_nodes_mutex, nodes.swap(m_nodes));
    for (CNode* pnode : nodes) {
        pnode->CloseSocketDisconnect();
        DeleteNode(pnode);
    }

    for (CNode* pnode : m_nodes_disconnected) {
        DeleteNode(pnode);
    }
    m_nodes_disconnected.clear();
    vhListenSocket.clear();
    semOutbound.reset();
    semAddnode.reset();
}